

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall Js::InterpreterStackFrame::ProcessLinkFailedAsmJsModule(InterpreterStackFrame *this)

{
  ulong uVar1;
  byte bVar2;
  ImplicitCallFlags flags;
  Utf8SourceInfo *pUVar3;
  ScriptContext *this_00;
  DebugManager *pDVar4;
  ScriptFunction *pSVar5;
  ExecutionMode EVar6;
  bool bVar7;
  void *pvVar8;
  FunctionBody *pFVar9;
  ThreadContext *this_01;
  Var pvVar10;
  ThreadContext *pTVar11;
  Var *stackAllocation;
  ulong uVar12;
  ThreadContext *pTVar13;
  PVOID unaff_retaddr;
  undefined1 auStack_b8 [16];
  Setup setup;
  PushPopFrameHelper pushPopFrameHelper;
  DynamicProfileInfo *local_48;
  bool local_40;
  ScriptFunction *local_38;
  ScriptFunction *funcObj;
  
  pTVar11 = (ThreadContext *)auStack_b8;
  AsmJSCompiler::OutputError(*(ScriptContext **)(this + 0x78),L"asm.js linking failed.");
  pvVar8 = FunctionProxy::GetAuxPtr(*(FunctionProxy **)(this + 0x88),AsmJsModuleInfo);
  if (*(char *)((long)pvVar8 + 0xac) == '\x01') {
    Throw::OutOfMemory();
  }
  local_38 = *(ScriptFunction **)(this + 0x80);
  JavascriptFunction::ReparseAsmJsModule(&local_38);
  pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
  EVar6 = FunctionBody::GetInterpreterExecutionMode(pFVar9,false);
  if (EVar6 == ProfilingInterpreter) {
LAB_0098aa6b:
    pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
    local_48 = FunctionBody::GetDynamicProfileInfo(pFVar9);
    ThreadContext::ClearImplicitCallFlags
              (((((((local_38->super_ScriptFunctionBase).super_JavascriptFunction.
                    super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr)->threadContext);
    local_40 = true;
  }
  else {
    pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
    pUVar3 = (pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    bVar2 = pUVar3->field_0xa8;
    if ((byte)((bVar2 & 0x40) >> 6 & (bVar2 >> 5 | (pUVar3->debugModeSource).ptr != (uchar *)0x0))
        == 1) {
      pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
      bVar7 = DynamicProfileInfo::IsEnabled(pFVar9);
      if (bVar7) goto LAB_0098aa6b;
    }
    local_40 = false;
    local_48 = (DynamicProfileInfo *)0x0;
  }
  Setup::Setup((Setup *)(auStack_b8 + 8),local_38,*(Var **)(this + 0x20),*(int *)(this + 0x18));
  uVar12 = (ulong)setup.localCount;
  uVar1 = uVar12 + (uint)setup.inSlotsCount;
  if (uVar1 < 0x8001) {
    ThreadContext::ProbeStack
              ((*(ScriptContext **)(this + 0x78))->threadContext,uVar1 * 8 + 0x4000,
               *(ScriptContext **)(this + 0x78),unaff_retaddr);
    pTVar11 = (ThreadContext *)(auStack_b8 + -(uVar1 * 8 + 0xf & 0xfffffffffffffff0));
    bVar7 = false;
    stackAllocation = (Var *)0x0;
    this_01 = pTVar11;
    pTVar13 = pTVar11;
    pushPopFrameHelper._16_8_ = pTVar11;
  }
  else {
    setup.bailedOut = false;
    setup.bailedOutOfInlinee = false;
    setup.isGeneratorFrame = false;
    setup._59_5_ = 0;
    bVar7 = ScriptContext::EnsureInterpreterArena
                      (*(ScriptContext **)(this + 0x78),(ArenaAllocator **)&setup.bailedOut);
    this_01 = (ThreadContext *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            setup._56_8_,(ulong)(uint)setup.inSlotsCount << 3);
    pushPopFrameHelper._16_8_ = this_01;
    if (uVar12 == 0) {
      stackAllocation = (Var *)0x0;
    }
    else {
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,uVar12 * 8 + 0x4000,
                 *(ScriptContext **)(this + 0x78),unaff_retaddr);
      pTVar11 = (ThreadContext *)(auStack_b8 + -(uVar12 * 8 + 0xf & 0xfffffffffffffff0));
      stackAllocation = (Var *)pTVar11;
    }
    pTVar13 = (ThreadContext *)&pushPopFrameHelper.m_isHiddenFrame;
  }
  pTVar11[-1].recyclerTelemetryHostInterface.super_RecyclerTelemetryHostInterface.
  _vptr_RecyclerTelemetryHostInterface = (_func_int **)0xfefefefefefefefe;
  pTVar11[-1].recyclerTelemetryHostInterface.tc = (ThreadContext *)0xfefefefefefefefe;
  pSVar5 = local_38;
  *(undefined8 *)&pTVar11[-1].threadId = 0x98ac04;
  pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar5);
  bVar2 = (pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  *(ThreadContextRecyclerTelemetryHostInterface **)&pTVar11[-1].threadId =
       &pTVar11[-1].recyclerTelemetryHostInterface;
  pTVar11[-1].rootTrackerScriptContext = (ScriptContext *)pTVar13;
  pTVar11[-1].entryPointToBuiltInOperationIdCache.stats = (Type)0x98ac2d;
  Setup::InitializeAllocation
            ((Setup *)(auStack_b8 + 8),(Var *)this_01,stackAllocation,(bool)((bVar2 & 4) >> 2),
             local_40,(LoopHeader *)0x0,(DWORD_PTR)pTVar11[-1].rootTrackerScriptContext,
             *(Var *)&pTVar11[-1].threadId);
  pSVar5 = local_38;
  *(undefined8 *)&pTVar11[-1].threadId = 0x98ac3a;
  pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar5);
  *(undefined8 *)&pTVar11[-1].threadId = 0x98ac47;
  ByteCodeReader::Create((ByteCodeReader *)this_01,pFVar9,0);
  pSVar5 = local_38;
  *(undefined8 *)&pTVar11[-1].threadId = 0x98ac50;
  pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar5);
  *(undefined8 *)&pTVar11[-1].threadId = 0x98ac58;
  FunctionBody::BeginExecution(pFVar9);
  pTVar13 = *(ThreadContext **)(this_01->X86_TEMP_SIMD[1].field_0.i64[1] + 0x3b8);
  setup._56_8_ = pTVar13;
  pushPopFrameHelper.m_threadContext = this_01;
  pushPopFrameHelper.m_interpreterFrame._0_1_ = 0;
  pDVar4 = *(DebugManager **)(this + 0xa0);
  *(undefined8 *)&this_01->noScriptScope = *(undefined8 *)(this + 0x98);
  this_01->debugManager = pDVar4;
  if ((*(byte *)(this_01->X86_TEMP_SIMD[2].field_0.i64[1] + 0x46) & 2) == 0) {
    *(undefined8 *)&pTVar11[-1].threadId = 0x98ac96;
    ThreadContext::PushInterpreterFrame(pTVar13,(InterpreterStackFrame *)this_01);
  }
  else {
    pushPopFrameHelper.m_interpreterFrame._0_1_ = 1;
  }
  *(undefined8 *)&pTVar11[-1].threadId = 0x98aca4;
  pvVar10 = ProcessUnprofiled((InterpreterStackFrame *)this_01);
  if (local_40 != false) {
    flags = *(ImplicitCallFlags *)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x1570);
    *(undefined8 *)&pTVar11[-1].threadId = 0x98acc8;
    DynamicProfileInfo::RecordImplicitCallFlags(local_48,flags);
  }
  if (bVar7 != false) {
    this_00 = *(ScriptContext **)(this + 0x78);
    *(undefined8 *)&pTVar11[-1].threadId = 0x98acd7;
    ScriptContext::ReleaseInterpreterArena(this_00);
  }
  *(undefined8 *)&pTVar11[-1].threadId = 0x98ace0;
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)&setup.bailedOut);
  return pvVar10;
}

Assistant:

Var InterpreterStackFrame::ProcessLinkFailedAsmJsModule()
    {
        AsmJSCompiler::OutputError(this->scriptContext, _u("asm.js linking failed."));

        Js::FunctionBody* asmJsModuleFunctionBody = GetFunctionBody();
        AsmJsModuleInfo* info = asmJsModuleFunctionBody->GetAsmJsModuleInfo();

        // do not support relinking with failed relink
        if (info->IsRuntimeProcessed())
        {
            Js::Throw::OutOfMemory();
        }

        ScriptFunction * funcObj = GetJavascriptFunction();
        ScriptFunction::ReparseAsmJsModule(&funcObj);
        const bool doProfile =
            funcObj->GetFunctionBody()->GetInterpreterExecutionMode(false) == ExecutionMode::ProfilingInterpreter ||
            (funcObj->GetFunctionBody()->IsInDebugMode() && DynamicProfileInfo::IsEnabled(funcObj->GetFunctionBody()));

        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        if (doProfile)
        {
            dynamicProfileInfo = funcObj->GetFunctionBody()->GetDynamicProfileInfo();
            funcObj->GetScriptContext()->GetThreadContext()->ClearImplicitCallFlags();
        }

        // after reparsing, we want to also use a new interpreter stack frame, as it will have different characteristics than the asm.js version
        InterpreterStackFrame::Setup setup(funcObj, m_inParams, m_inSlotsCount);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
        size_t varSizeInBytes;

        Var* allocation = nullptr;
        Var* stackAllocation = nullptr;
        DWORD_PTR stackAddr;
        bool fReleaseAlloc = false;
        if ((varAllocCount + stackVarAllocCount) > InterpreterStackFrame::LocalsThreshold)
        {
            ArenaAllocator *tmpAlloc = nullptr;
            fReleaseAlloc = GetScriptContext()->EnsureInterpreterArena(&tmpAlloc);
            varSizeInBytes = varAllocCount * sizeof(Var);
            allocation = (Var*)tmpAlloc->Alloc(varSizeInBytes);
            if (stackVarAllocCount != 0)
            {
                size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Var);
                PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(GetScriptContext(), Js::Constants::MinStackInterpreter + stackVarSizeInBytes);
                stackAllocation = (Var*)_alloca(stackVarSizeInBytes);
            }
            // use a stack address so the debugger stepping logic works (step-out, for example, compares stack depths to determine when to complete the step)
            // debugger stepping does not matter here, but it's worth being consistent with normal stack frame
            stackAddr = reinterpret_cast<DWORD_PTR>(&allocation);
        }
        else
        {
            varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Var);
            PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(GetScriptContext(), Js::Constants::MinStackInterpreter + varSizeInBytes);
            allocation = (Var*)_alloca(varSizeInBytes);
            stackAddr = reinterpret_cast<DWORD_PTR>(allocation);
        }

#if DBG
        Var invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
        memset(invalidStackVar, 0xFE, sizeof(Js::RecyclableObject));
#endif

        InterpreterStackFrame * newInstance = setup.InitializeAllocation(allocation, stackAllocation, funcObj->GetFunctionBody()->GetHasImplicitArgIns(), doProfile, nullptr, stackAddr
#if DBG
            , invalidStackVar
#endif
            );

        newInstance->m_reader.Create(funcObj->GetFunctionBody());
        // now that we have set up the new frame, let's interpret it!
        funcObj->GetFunctionBody()->BeginExecution();

        PushPopFrameHelper pushPopFrameHelper(newInstance, this->returnAddress, this->addressOfReturnAddress);
        Var retVal = newInstance->ProcessUnprofiled();

        if (doProfile)
        {
            dynamicProfileInfo->RecordImplicitCallFlags(GetScriptContext()->GetThreadContext()->GetImplicitCallFlags());
        }

        if (fReleaseAlloc)
        {
            GetScriptContext()->ReleaseInterpreterArena();
        }

        return retVal;
    }